

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subscription.cpp
# Opt level: O0

bool __thiscall
miniros::Subscription::addCallback
          (Subscription *this,SubscriptionCallbackHelperPtr *helper,string *md5sum,
          CallbackQueueInterface *queue,int32_t queue_size,VoidConstPtr *tracked_object,
          bool allow_concurrent_callbacks)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *peVar4;
  TimeBase<miniros::Time,_miniros::Duration> receipt_time;
  iterator this_00;
  reference helper_00;
  element_type *this_01;
  iterator deserializer;
  iterator iVar5;
  pointer ppVar6;
  element_type *peVar7;
  CallbackQueueInterface *in_RCX;
  string *in_RDX;
  long in_RDI;
  __shared_ptr *in_R9;
  byte in_stack_00000008;
  bool was_full;
  shared_ptr<miniros::MessageDeserializer> des;
  LatchInfo *latch_info;
  iterator des_it;
  PublisherLinkPtr *link;
  iterator __end3;
  iterator __begin3;
  V_PublisherLink *__range3;
  scoped_lock<std::mutex> lock_2;
  CallbackInfoPtr info;
  scoped_lock<std::mutex> lock_1;
  scoped_lock<std::mutex> lock;
  TimeBase<miniros::Time,_miniros::Duration> in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  value_type *in_stack_fffffffffffffe48;
  __shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2> *this_02;
  vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
  *in_stack_fffffffffffffe50;
  CallbackQueueInterface *pCVar8;
  undefined4 in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe6c;
  element_type *in_stack_fffffffffffffe70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe78;
  bool local_12a;
  undefined1 local_118 [16];
  TimeBase<miniros::Time,_miniros::Duration> local_108;
  _Alloc_hider local_f9;
  undefined1 in_stack_ffffffffffffff17;
  undefined8 tracked_object_00;
  undefined1 has_tracked_object;
  bool *in_stack_ffffffffffffff58;
  __shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2> local_98;
  byte local_79;
  string local_78 [63];
  byte local_39;
  __shared_ptr *local_38;
  CallbackQueueInterface *local_28;
  string *local_20;
  bool local_1;
  
  local_39 = in_stack_00000008 & 1;
  local_38 = in_R9;
  local_28 = in_RCX;
  local_20 = in_RDX;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe40,
             (mutex_type *)in_stack_fffffffffffffe38);
  bVar1 = std::operator==(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  if ((bVar1) &&
     (bVar1 = std::operator!=(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38), bVar1))
  {
    std::__cxx11::string::operator=((string *)(in_RDI + 0x60),local_20);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d6d40);
  bVar1 = std::operator!=(in_stack_fffffffffffffe40,(char *)in_stack_fffffffffffffe38);
  local_79 = 0;
  local_12a = false;
  if (bVar1) {
    md5sum_abi_cxx11_((Subscription *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68))
    ;
    local_79 = 1;
    local_12a = std::operator!=(in_stack_fffffffffffffe40,
                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffe38);
  }
  if ((local_79 & 1) != 0) {
    std::__cxx11::string::~string(local_78);
  }
  if (local_12a == false) {
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe40,
               (mutex_type *)in_stack_fffffffffffffe38);
    std::make_shared<miniros::Subscription::CallbackInfo>();
    std::
    __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d6e42);
    std::shared_ptr<miniros::SubscriptionCallbackHelper>::operator=
              ((shared_ptr<miniros::SubscriptionCallbackHelper> *)in_stack_fffffffffffffe40,
               (shared_ptr<miniros::SubscriptionCallbackHelper> *)in_stack_fffffffffffffe38);
    peVar3 = std::
             __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4d6e6d);
    peVar3->callback_queue_ = local_28;
    std::make_shared<miniros::SubscriptionQueue,std::__cxx11::string&,int&,bool&>
              (in_stack_fffffffffffffe78,(int *)in_stack_fffffffffffffe70,
               (bool *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    std::
    __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d6eb0);
    std::shared_ptr<miniros::SubscriptionQueue>::operator=
              ((shared_ptr<miniros::SubscriptionQueue> *)in_stack_fffffffffffffe40,
               (shared_ptr<miniros::SubscriptionQueue> *)in_stack_fffffffffffffe38);
    std::shared_ptr<miniros::SubscriptionQueue>::~shared_ptr
              ((shared_ptr<miniros::SubscriptionQueue> *)0x4d6ed1);
    std::
    __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x4d6eeb);
    std::weak_ptr<void_const>::operator=
              ((weak_ptr<const_void> *)in_stack_fffffffffffffe40,
               (shared_ptr<const_void> *)in_stack_fffffffffffffe38);
    peVar3 = std::
             __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4d6f09);
    peVar3->has_tracked_object_ = false;
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_38);
    if (bVar1) {
      peVar3 = std::
               __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4d6f2d);
      peVar3->has_tracked_object_ = true;
    }
    peVar4 = std::
             __shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<miniros::SubscriptionCallbackHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x4d6f72);
    uVar2 = (*peVar4->_vptr_SubscriptionCallbackHelper[5])();
    if ((uVar2 & 1) == 0) {
      *(int *)(in_RDI + 0xe0) = *(int *)(in_RDI + 0xe0) + 1;
    }
    std::
    vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
    ::push_back(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::
    vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
    ::size((vector<std::shared_ptr<miniros::Subscription::CallbackInfo>,_std::allocator<std::shared_ptr<miniros::Subscription::CallbackInfo>_>_>
            *)(in_RDI + 200));
    std::
    vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
    ::reserve((vector<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>,_std::allocator<std::pair<const_std::type_info_*,_std::shared_ptr<miniros::MessageDeserializer>_>_>_>
               *)in_stack_fffffffffffffe70,
              CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
    bVar1 = std::
            map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
            ::empty((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                     *)0x4d7008);
    if (!bVar1) {
      std::scoped_lock<std::mutex>::scoped_lock
                ((scoped_lock<std::mutex> *)in_stack_fffffffffffffe40,
                 (mutex_type *)in_stack_fffffffffffffe38);
      receipt_time = (TimeBase<miniros::Time,_miniros::Duration>)
                     std::
                     vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                     ::begin((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                              *)in_stack_fffffffffffffe38);
      this_00 = std::
                vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                ::end((vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>
                       *)in_stack_fffffffffffffe38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                                 *)in_stack_fffffffffffffe40,
                                (__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                                 *)in_stack_fffffffffffffe38), bVar1) {
        helper_00 = __gnu_cxx::
                    __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                    ::operator*((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                                 *)&stack0xffffffffffffff40);
        this_01 = std::
                  __shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  ::operator->((__shared_ptr_access<miniros::PublisherLink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                *)0x4d70ae);
        bVar1 = PublisherLink::isLatched(this_01);
        if (bVar1) {
          deserializer = std::
                         map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                         ::find((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                                 *)in_stack_fffffffffffffe38,(key_type *)0x4d7100);
          iVar5 = std::
                  map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                  ::end((map<std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo,_std::less<std::shared_ptr<miniros::PublisherLink>_>,_std::allocator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>_>
                         *)in_stack_fffffffffffffe38);
          has_tracked_object = (undefined1)((ulong)iVar5._M_node >> 0x38);
          bVar1 = std::operator==((_Self *)&stack0xffffffffffffff28,
                                  (_Self *)&stack0xffffffffffffff20);
          if (!bVar1) {
            ppVar6 = std::
                     _Rb_tree_iterator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>
                     ::operator->((_Rb_tree_iterator<std::pair<const_std::shared_ptr<miniros::PublisherLink>,_miniros::Subscription::LatchInfo>_>
                                   *)0x4d715d);
            tracked_object_00 = &ppVar6->second;
            std::
            make_shared<miniros::MessageDeserializer,std::shared_ptr<miniros::SubscriptionCallbackHelper>const&,miniros::SerializedMessage_const&,std::shared_ptr<std::map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>const&>
                      ((shared_ptr<miniros::SubscriptionCallbackHelper> *)in_stack_fffffffffffffe78,
                       (SerializedMessage *)in_stack_fffffffffffffe70,
                       (shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
            local_f9 = (_Alloc_hider)0x0;
            std::
            __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4d71a9);
            in_stack_fffffffffffffe70 =
                 std::
                 __shared_ptr_access<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<miniros::SubscriptionQueue,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x4d71b5);
            peVar3 = std::
                     __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x4d71c4);
            in_stack_fffffffffffffe78 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &peVar3->helper_;
            peVar3 = std::
                     __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x4d71d7);
            in_stack_fffffffffffffe6c = (uint)peVar3->has_tracked_object_;
            std::
            __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4d71e9);
            in_stack_fffffffffffffe38 =
                 *(TimeBase<miniros::Time,_miniros::Duration> *)(tracked_object_00 + 0x58);
            in_stack_fffffffffffffe40 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_f9;
            local_108 = in_stack_fffffffffffffe38;
            SubscriptionQueue::push
                      ((SubscriptionQueue *)this_00._M_current,
                       (SubscriptionCallbackHelperPtr *)helper_00,
                       (MessageDeserializerPtr *)deserializer._M_node,(bool)has_tracked_object,
                       (VoidConstWPtr *)tracked_object_00,(bool)in_stack_ffffffffffffff17,
                       (Time)receipt_time,in_stack_ffffffffffffff58);
            if (((byte)local_f9 & 1) == 0) {
              this_02 = &local_98;
              peVar3 = std::
                       __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x4d7264);
              pCVar8 = peVar3->callback_queue_;
              std::
              __shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x4d7276);
              std::shared_ptr<miniros::CallbackInterface>::
              shared_ptr<miniros::SubscriptionQueue,void>
                        ((shared_ptr<miniros::CallbackInterface> *)in_stack_fffffffffffffe40,
                         (shared_ptr<miniros::SubscriptionQueue> *)in_stack_fffffffffffffe38);
              peVar7 = std::
                       __shared_ptr<miniros::Subscription::CallbackInfo,_(__gnu_cxx::_Lock_policy)2>
                       ::get(this_02);
              (*pCVar8->_vptr_CallbackQueueInterface[2])(pCVar8,local_118,peVar7);
              std::shared_ptr<miniros::CallbackInterface>::~shared_ptr
                        ((shared_ptr<miniros::CallbackInterface> *)0x4d72be);
            }
            std::shared_ptr<miniros::MessageDeserializer>::~shared_ptr
                      ((shared_ptr<miniros::MessageDeserializer> *)0x4d7306);
          }
        }
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
        ::operator++((__normal_iterator<std::shared_ptr<miniros::PublisherLink>_*,_std::vector<std::shared_ptr<miniros::PublisherLink>,_std::allocator<std::shared_ptr<miniros::PublisherLink>_>_>_>
                      *)&stack0xffffffffffffff40);
      }
      std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d7334);
    }
    std::shared_ptr<miniros::Subscription::CallbackInfo>::~shared_ptr
              ((shared_ptr<miniros::Subscription::CallbackInfo> *)0x4d7352);
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x4d735f);
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Subscription::addCallback(const SubscriptionCallbackHelperPtr& helper, const std::string& md5sum,
  CallbackQueueInterface* queue, int32_t queue_size, const VoidConstPtr& tracked_object, bool allow_concurrent_callbacks)
{
  MINIROS_ASSERT(helper);
  MINIROS_ASSERT(queue);


  // Decay to a real type as soon as we have a subscriber with a real type
  {
    std::scoped_lock<std::mutex> lock(md5sum_mutex_);
    if (md5sum_ == "*" && md5sum != "*")
    {

      md5sum_ = md5sum;
    }
  }

  if (md5sum != "*" && md5sum != this->md5sum())
  {
    return false;
  }

  {
    std::scoped_lock<std::mutex> lock(callbacks_mutex_);

    CallbackInfoPtr info(std::make_shared<CallbackInfo>());
    info->helper_ = helper;
    info->callback_queue_ = queue;
    info->subscription_queue_ = std::make_shared<SubscriptionQueue>(name_, queue_size, allow_concurrent_callbacks);
    info->tracked_object_ = tracked_object;
    info->has_tracked_object_ = false;
    if (tracked_object)
    {
      info->has_tracked_object_ = true;
    }

    if (!helper->isConst())
    {
      ++nonconst_callbacks_;
    }

    callbacks_.push_back(info);
    cached_deserializers_.reserve(callbacks_.size());

    // if we have any latched links, we need to immediately schedule callbacks
    if (!latched_messages_.empty())
    {
      std::scoped_lock<std::mutex> lock(publisher_links_mutex_);

      for (const PublisherLinkPtr& link: publisher_links_)
      {
        if (!link->isLatched())
          continue;

        auto des_it = latched_messages_.find(link);
        if (des_it == latched_messages_.end())
          continue;

        const LatchInfo& latch_info = des_it->second;
        auto des = std::make_shared<MessageDeserializer>(helper, latch_info.message, latch_info.connection_header);
        bool was_full = false;
        info->subscription_queue_->push(info->helper_, des, info->has_tracked_object_, info->tracked_object_, true, latch_info.receipt_time, &was_full);
        if (!was_full)
        {
          info->callback_queue_->addCallback(info->subscription_queue_, (uint64_t)info.get());
        }
      }
    }
  }

  return true;
}